

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  AccelData *pAVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar24;
  uint uVar25;
  undefined4 uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  size_t sVar31;
  size_t sVar32;
  size_t sVar33;
  Primitive *prim;
  size_t sVar34;
  ulong uVar35;
  ulong uVar36;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar37;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar38;
  uint uVar46;
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  vint4 ai_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi;
  undefined1 auVar52 [16];
  vint4 bi_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 ai_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar66 [64];
  Precalculations pre;
  undefined1 local_26d8 [16];
  undefined4 local_26b8;
  vint4 bi_8;
  vbool<4> valid0;
  undefined1 local_25d8 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_25c8;
  undefined4 local_25b8;
  undefined4 uStack_25b4;
  undefined4 uStack_25b0;
  undefined4 uStack_25ac;
  undefined1 local_25a8 [16];
  float local_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float local_2588;
  float fStack_2584;
  float fStack_2580;
  float fStack_257c;
  float local_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  undefined8 local_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  InstanceIntersectorK<4> local_2548 [16];
  uint local_2538;
  uint uStack_2534;
  uint uStack_2530;
  uint uStack_252c;
  uint uStack_2528;
  uint uStack_2524;
  uint uStack_2520;
  uint uStack_251c;
  undefined4 local_2518;
  undefined4 uStack_2514;
  undefined4 uStack_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 uStack_2500;
  undefined4 uStack_24fc;
  undefined4 local_24f8;
  undefined4 uStack_24f4;
  undefined4 uStack_24f0;
  undefined4 uStack_24ec;
  undefined4 uStack_24e8;
  undefined4 uStack_24e4;
  undefined4 uStack_24e0;
  undefined4 uStack_24dc;
  uint local_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  uint uStack_24c0;
  uint uStack_24bc;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  uint local_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  uint uStack_2480;
  uint uStack_247c;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  uint local_2458;
  uint uStack_2454;
  uint uStack_2450;
  uint uStack_244c;
  uint uStack_2448;
  uint uStack_2444;
  uint uStack_2440;
  uint uStack_243c;
  float local_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float fStack_2420;
  float fStack_241c;
  uint local_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  uint uStack_2400;
  uint uStack_23fc;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  uint local_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint uStack_23c0;
  uint uStack_23bc;
  uint local_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  uint uStack_23a0;
  uint uStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  
  auVar62 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
  auVar66 = ZEXT1664(auVar62);
  auVar63 = vpcmpeqd_avx(auVar62,(undefined1  [16])valid_i->field_0);
  uVar25 = vmovmskps_avx(auVar63);
  if (uVar25 == 0) {
    return;
  }
  local_25c8 = valid_i->field_0;
  pAVar2 = This->ptr;
  uVar28 = (ulong)(uVar25 & 0xff);
  auVar65 = *(undefined1 (*) [16])(ray + 0x40);
  auVar53._8_4_ = 0x7fffffff;
  auVar53._0_8_ = 0x7fffffff7fffffff;
  auVar53._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx(auVar65,auVar53);
  auVar56._8_4_ = 0x219392ef;
  auVar56._0_8_ = 0x219392ef219392ef;
  auVar56._12_4_ = 0x219392ef;
  auVar3 = vcmpps_avx(auVar3,auVar56,1);
  auVar49 = vblendvps_avx(auVar65,auVar56,auVar3);
  auVar3 = *(undefined1 (*) [16])(ray + 0x50);
  auVar50 = vandps_avx(auVar3,auVar53);
  auVar50 = vcmpps_avx(auVar50,auVar56,1);
  auVar4 = vblendvps_avx(auVar3,auVar56,auVar50);
  auVar50 = *(undefined1 (*) [16])(ray + 0x60);
  auVar53 = vandps_avx(auVar50,auVar53);
  auVar53 = vcmpps_avx(auVar53,auVar56,1);
  auVar53 = vblendvps_avx(auVar50,auVar56,auVar53);
  auVar56 = vrcpps_avx(auVar49);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar49 = vfnmadd213ps_fma(auVar49,auVar56,auVar57);
  auVar56 = vfmadd132ps_fma(auVar49,auVar56,auVar56);
  auVar49 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar49,auVar57);
  auVar4 = vfmadd132ps_fma(auVar4,auVar49,auVar49);
  auVar49 = vrcpps_avx(auVar53);
  auVar53 = vfnmadd213ps_fma(auVar53,auVar49,auVar57);
  auVar49 = vfmadd132ps_fma(auVar53,auVar49,auVar49);
  auVar57 = ZEXT816(0);
  auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar57);
  local_25a8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar57);
  auVar64 = ZEXT1664(auVar62 ^ auVar63);
  auVar39._8_4_ = 1;
  auVar39._0_8_ = 0x100000001;
  auVar39._12_4_ = 1;
  auVar65 = vcmpps_avx(auVar65,auVar57,1);
  auVar65 = vandps_avx(auVar65,auVar39);
  auVar47._8_4_ = 2;
  auVar47._0_8_ = 0x200000002;
  auVar47._12_4_ = 2;
  auVar3 = vcmpps_avx(auVar3,auVar57,1);
  auVar3 = vandps_avx(auVar3,auVar47);
  auVar3 = vorps_avx(auVar3,auVar65);
  auVar65 = vcmpps_avx(auVar50,auVar57,1);
  auVar50._8_4_ = 4;
  auVar50._0_8_ = 0x400000004;
  auVar50._12_4_ = 4;
  auVar65 = vandps_avx(auVar65,auVar50);
  auVar62 = vpor_avx(auVar62 ^ auVar63,auVar65);
  local_25d8 = vpor_avx(auVar62,auVar3);
  local_2578 = *(float *)ray;
  fStack_2574 = *(float *)(ray + 4);
  fStack_2570 = *(float *)(ray + 8);
  fStack_256c = *(float *)(ray + 0xc);
  auVar65._0_4_ = auVar56._0_4_ * -*(float *)ray;
  auVar65._4_4_ = auVar56._4_4_ * -*(float *)(ray + 4);
  auVar65._8_4_ = auVar56._8_4_ * -*(float *)(ray + 8);
  auVar65._12_4_ = auVar56._12_4_ * -*(float *)(ray + 0xc);
  local_2588 = *(float *)(ray + 0x10);
  fStack_2584 = *(float *)(ray + 0x14);
  fStack_2580 = *(float *)(ray + 0x18);
  fStack_257c = *(float *)(ray + 0x1c);
  auVar62._0_4_ = auVar4._0_4_ * -*(float *)(ray + 0x10);
  auVar62._4_4_ = auVar4._4_4_ * -*(float *)(ray + 0x14);
  auVar62._8_4_ = auVar4._8_4_ * -*(float *)(ray + 0x18);
  auVar62._12_4_ = auVar4._12_4_ * -*(float *)(ray + 0x1c);
  local_2598 = *(float *)(ray + 0x20);
  fStack_2594 = *(float *)(ray + 0x24);
  fStack_2590 = *(float *)(ray + 0x28);
  fStack_258c = *(float *)(ray + 0x2c);
  auVar63._0_4_ = auVar49._0_4_ * -*(float *)(ray + 0x20);
  auVar63._4_4_ = auVar49._4_4_ * -*(float *)(ray + 0x24);
  auVar63._8_4_ = auVar49._8_4_ * -*(float *)(ray + 0x28);
  auVar63._12_4_ = auVar49._12_4_ * -*(float *)(ray + 0x2c);
  local_2538 = 0x80000000;
  uStack_2534 = 0x80000000;
  uStack_2530 = 0x80000000;
  uStack_252c = 0x80000000;
  uStack_2528 = 0x80000000;
  uStack_2524 = 0x80000000;
  uStack_2520 = 0x80000000;
  uStack_251c = 0x80000000;
  local_25b8 = 0x7f800000;
  uStack_25b4 = 0x7f800000;
  uStack_25b0 = 0x7f800000;
  uStack_25ac = 0x7f800000;
LAB_016898e2:
  lVar11 = 0;
  for (uVar27 = uVar28; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar11 = lVar11 + 1;
  }
  uVar26 = *(undefined4 *)(local_25d8 + lVar11 * 4);
  auVar40._4_4_ = uVar26;
  auVar40._0_4_ = uVar26;
  auVar40._8_4_ = uVar26;
  auVar40._12_4_ = uVar26;
  local_26d8 = vpcmpeqd_avx(auVar40,local_25d8);
  uVar26 = vmovmskps_avx(local_26d8);
  uVar27 = CONCAT44((int)((ulong)lVar11 >> 0x20),uVar26);
  uVar28 = ~uVar27 & uVar28;
  auVar7._4_4_ = fStack_2574;
  auVar7._0_4_ = local_2578;
  auVar7._8_4_ = fStack_2570;
  auVar7._12_4_ = fStack_256c;
  auVar59._8_4_ = 0x7f800000;
  auVar59._0_8_ = 0x7f8000007f800000;
  auVar59._12_4_ = 0x7f800000;
  auVar3 = vblendvps_avx(auVar59,auVar7,local_26d8);
  auVar50 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vminps_avx(auVar50,auVar3);
  auVar50 = vshufpd_avx(auVar3,auVar3,1);
  auVar50 = vminps_avx(auVar50,auVar3);
  auVar6._4_4_ = fStack_2584;
  auVar6._0_4_ = local_2588;
  auVar6._8_4_ = fStack_2580;
  auVar6._12_4_ = fStack_257c;
  auVar3 = vblendvps_avx(auVar59,auVar6,local_26d8);
  auVar39 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vminps_avx(auVar39,auVar3);
  auVar39 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vminps_avx(auVar39,auVar3);
  auVar50 = vinsertps_avx(auVar50,auVar3,0x1c);
  auVar5._4_4_ = fStack_2594;
  auVar5._0_4_ = local_2598;
  auVar5._8_4_ = fStack_2590;
  auVar5._12_4_ = fStack_258c;
  auVar3 = vblendvps_avx(auVar59,auVar5,local_26d8);
  auVar39 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vminps_avx(auVar39,auVar3);
  auVar39 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vminps_avx(auVar39,auVar3);
  auVar39 = vinsertps_avx(auVar50,auVar3,0x20);
  auVar61._8_4_ = 0xff800000;
  auVar61._0_8_ = 0xff800000ff800000;
  auVar61._12_4_ = 0xff800000;
  auVar3 = vblendvps_avx(auVar61,auVar7,local_26d8);
  auVar50 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vmaxps_avx(auVar50,auVar3);
  auVar50 = vshufpd_avx(auVar3,auVar3,1);
  auVar50 = vmaxps_avx(auVar50,auVar3);
  auVar3 = vblendvps_avx(auVar61,auVar6,local_26d8);
  auVar47 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar47 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar50 = vinsertps_avx(auVar50,auVar3,0x1c);
  auVar3 = vblendvps_avx(auVar61,auVar5,local_26d8);
  auVar47 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar47 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar57 = vinsertps_avx(auVar50,auVar3,0x20);
  auVar3 = vblendvps_avx(auVar59,auVar56,local_26d8);
  auVar50 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vminps_avx(auVar50,auVar3);
  auVar50 = vshufpd_avx(auVar3,auVar3,1);
  auVar50 = vminps_avx(auVar50,auVar3);
  auVar3 = vblendvps_avx(auVar59,auVar4,local_26d8);
  auVar47 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vminps_avx(auVar47,auVar3);
  auVar47 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vminps_avx(auVar47,auVar3);
  auVar50 = vinsertps_avx(auVar50,auVar3,0x1c);
  auVar3 = vblendvps_avx(auVar59,auVar49,local_26d8);
  auVar47 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vminps_avx(auVar47,auVar3);
  auVar47 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vminps_avx(auVar47,auVar3);
  auVar44 = vinsertps_avx(auVar50,auVar3,0x20);
  auVar3 = vblendvps_avx(auVar61,auVar56,local_26d8);
  auVar50 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vmaxps_avx(auVar50,auVar3);
  auVar50 = vshufpd_avx(auVar3,auVar3,1);
  auVar50 = vmaxps_avx(auVar50,auVar3);
  auVar3 = vblendvps_avx(auVar61,auVar4,local_26d8);
  auVar47 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar47 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar50 = vinsertps_avx(auVar50,auVar3,0x1c);
  auVar3 = vblendvps_avx(auVar61,auVar49,local_26d8);
  auVar47 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar47 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vmaxps_avx(auVar47,auVar3);
  auVar5 = vinsertps_avx(auVar50,auVar3,0x20);
  auVar3 = vblendvps_avx(auVar59,auVar53,local_26d8);
  auVar50 = vshufps_avx(auVar3,auVar3,0xb1);
  auVar7 = vminps_avx(auVar50,auVar3);
  auVar40 = vshufpd_avx(auVar7,auVar7,1);
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx(auVar61,local_25a8,local_26d8);
  auVar3 = vshufps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0,0xb1);
  auVar6 = vmaxps_avx(auVar3,(undefined1  [16])bi_8.field_0);
  auVar47 = vcmpps_avx(auVar44,_DAT_01f45a50,5);
  auVar3 = vblendvps_avx(auVar5,auVar44,auVar47);
  auVar50 = vblendvps_avx(auVar39,auVar57,auVar47);
  auVar39 = vblendvps_avx(auVar57,auVar39,auVar47);
  auVar54 = vshufpd_avx(auVar6,auVar6,1);
  local_2398 = auVar3._0_4_;
  auVar57 = vmovshdup_avx(auVar3);
  local_2568 = auVar57._0_8_;
  uVar30 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x40;
  auVar57 = vshufpd_avx(auVar3,auVar3,1);
  uVar36 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x80;
  auVar7 = vminps_avx(auVar40,auVar7);
  auVar57 = vmaxps_avx(auVar54,auVar6);
  auVar47 = vblendvps_avx(auVar44,auVar5,auVar47);
  auVar60._0_4_ = auVar50._0_4_ * local_2398;
  auVar60._4_4_ = auVar50._4_4_ * auVar3._4_4_;
  auVar60._8_4_ = auVar50._8_4_ * auVar3._8_4_;
  auVar60._12_4_ = auVar50._12_4_ * auVar3._12_4_;
  local_2438 = auVar47._0_4_;
  auVar54._0_4_ = auVar39._0_4_ * local_2438;
  auVar54._4_4_ = auVar39._4_4_ * auVar47._4_4_;
  auVar54._8_4_ = auVar39._8_4_ * auVar47._8_4_;
  auVar54._12_4_ = auVar39._12_4_ * auVar47._12_4_;
  auVar64 = ZEXT1664(auVar64._0_16_);
  uVar35 = (ulong)(local_2398 < 0.0) * 0x20;
  stack[0].ptr.ptr = *(size_t *)&pAVar2[1].bounds.bounds0.lower.field_0;
  stack[0].mask = uVar27;
  fStack_2394 = local_2398;
  fStack_2390 = local_2398;
  fStack_238c = local_2398;
  fStack_2388 = local_2398;
  fStack_2384 = local_2398;
  fStack_2380 = local_2398;
  fStack_237c = local_2398;
  local_23b8 = (uint)auVar60._0_4_ ^ local_2538;
  uStack_23b4 = (uint)auVar60._0_4_ ^ uStack_2534;
  uStack_23b0 = (uint)auVar60._0_4_ ^ uStack_2530;
  uStack_23ac = (uint)auVar60._0_4_ ^ uStack_252c;
  uStack_23a8 = (uint)auVar60._0_4_ ^ uStack_2528;
  uStack_23a4 = (uint)auVar60._0_4_ ^ uStack_2524;
  uStack_23a0 = (uint)auVar60._0_4_ ^ uStack_2520;
  uStack_239c = (uint)auVar60._0_4_ ^ uStack_251c;
  uStack_2560 = local_2568;
  uStack_2558 = local_2568;
  uStack_2550 = local_2568;
  auVar50 = vmovshdup_avx(auVar60);
  uVar25 = auVar50._0_4_;
  uVar46 = auVar50._4_4_;
  local_23d8 = uVar25 ^ local_2538;
  uStack_23d4 = uVar46 ^ uStack_2534;
  uStack_23d0 = uVar25 ^ uStack_2530;
  uStack_23cc = uVar46 ^ uStack_252c;
  uStack_23c8 = uVar25 ^ uStack_2528;
  uStack_23c4 = uVar46 ^ uStack_2524;
  uStack_23c0 = uVar25 ^ uStack_2520;
  uStack_23bc = uVar46 ^ uStack_251c;
  auVar3 = vshufps_avx(auVar3,auVar3,0xaa);
  local_23f8 = auVar3._0_8_;
  uStack_23f0 = local_23f8;
  uStack_23e8 = local_23f8;
  uStack_23e0 = local_23f8;
  auVar3 = vshufps_avx(auVar60,auVar60,0xaa);
  uVar25 = auVar3._0_4_;
  uVar46 = auVar3._4_4_;
  local_2418 = uVar25 ^ local_2538;
  uStack_2414 = uVar46 ^ uStack_2534;
  uStack_2410 = uVar25 ^ uStack_2530;
  uStack_240c = uVar46 ^ uStack_252c;
  uStack_2408 = uVar25 ^ uStack_2528;
  uStack_2404 = uVar46 ^ uStack_2524;
  uStack_2400 = uVar25 ^ uStack_2520;
  uStack_23fc = uVar46 ^ uStack_251c;
  fStack_2434 = local_2438;
  fStack_2430 = local_2438;
  fStack_242c = local_2438;
  fStack_2428 = local_2438;
  fStack_2424 = local_2438;
  fStack_2420 = local_2438;
  fStack_241c = local_2438;
  local_2458 = (uint)auVar54._0_4_ ^ local_2538;
  uStack_2454 = (uint)auVar54._0_4_ ^ uStack_2534;
  uStack_2450 = (uint)auVar54._0_4_ ^ uStack_2530;
  uStack_244c = (uint)auVar54._0_4_ ^ uStack_252c;
  uStack_2448 = (uint)auVar54._0_4_ ^ uStack_2528;
  uStack_2444 = (uint)auVar54._0_4_ ^ uStack_2524;
  uStack_2440 = (uint)auVar54._0_4_ ^ uStack_2520;
  uStack_243c = (uint)auVar54._0_4_ ^ uStack_251c;
  auVar3 = vmovshdup_avx(auVar47);
  local_2478 = auVar3._0_8_;
  uStack_2470 = local_2478;
  uStack_2468 = local_2478;
  uStack_2460 = local_2478;
  auVar3 = vmovshdup_avx(auVar54);
  uVar25 = auVar3._0_4_;
  uVar46 = auVar3._4_4_;
  local_2498 = uVar25 ^ local_2538;
  uStack_2494 = uVar46 ^ uStack_2534;
  uStack_2490 = uVar25 ^ uStack_2530;
  uStack_248c = uVar46 ^ uStack_252c;
  uStack_2488 = uVar25 ^ uStack_2528;
  uStack_2484 = uVar46 ^ uStack_2524;
  uStack_2480 = uVar25 ^ uStack_2520;
  uStack_247c = uVar46 ^ uStack_251c;
  auVar3 = vshufps_avx(auVar47,auVar47,0xaa);
  local_24b8 = auVar3._0_8_;
  uStack_24b0 = local_24b8;
  uStack_24a8 = local_24b8;
  uStack_24a0 = local_24b8;
  auVar3 = vshufps_avx(auVar54,auVar54,0xaa);
  uVar25 = auVar3._0_4_;
  uVar46 = auVar3._4_4_;
  local_24d8 = uVar25 ^ local_2538;
  uStack_24d4 = uVar46 ^ uStack_2534;
  uStack_24d0 = uVar25 ^ uStack_2530;
  uStack_24cc = uVar46 ^ uStack_252c;
  uStack_24c8 = uVar25 ^ uStack_2528;
  uStack_24c4 = uVar46 ^ uStack_2524;
  uStack_24c0 = uVar25 ^ uStack_2520;
  uStack_24bc = uVar46 ^ uStack_251c;
  local_26b8 = auVar7._0_4_;
  local_24f8 = local_26b8;
  uStack_24f4 = local_26b8;
  uStack_24f0 = local_26b8;
  uStack_24ec = local_26b8;
  uStack_24e8 = local_26b8;
  uStack_24e4 = local_26b8;
  uStack_24e0 = local_26b8;
  uStack_24dc = local_26b8;
  local_2518 = auVar57._0_4_;
  uStack_2514 = local_2518;
  uStack_2510 = local_2518;
  uStack_250c = local_2518;
  uStack_2508 = local_2518;
  uStack_2504 = local_2518;
  uStack_2500 = local_2518;
  uStack_24fc = local_2518;
  pSVar38 = stack + 1;
  auVar3._4_4_ = uStack_25b4;
  auVar3._0_4_ = local_25b8;
  auVar3._8_4_ = uStack_25b0;
  auVar3._12_4_ = uStack_25ac;
  auVar3 = vblendvps_avx(auVar3,auVar53,local_26d8);
  auVar44 = auVar3;
LAB_01689cd4:
  auVar45 = ZEXT1664(auVar44);
  uVar26 = vmovmskps_avx(auVar64._0_16_);
  pSVar37 = pSVar38;
  do {
    auVar50 = auVar45._0_16_;
    if (pSVar37 == stack) goto LAB_0168a010;
    pSVar38 = pSVar37 + -1;
    pSVar24 = pSVar37 + -1;
    pSVar37 = pSVar38;
    if ((pSVar24->mask & ~CONCAT44((int)(uVar27 >> 0x20),uVar26)) != 0) {
      sVar34 = 1;
      sVar33 = (pSVar38->ptr).ptr;
      do {
        pSVar37 = pSVar38;
        if ((sVar33 & 8) != 0) {
          if (sVar34 != 0) {
            aVar42._0_4_ = auVar64._0_4_ ^ auVar66._0_4_;
            aVar42._4_4_ = auVar64._4_4_ ^ auVar66._4_4_;
            aVar42._8_4_ = auVar64._8_4_ ^ auVar66._8_4_;
            aVar42._12_4_ = auVar64._12_4_ ^ auVar66._12_4_;
            uVar27 = (ulong)((uint)sVar33 & 0xf) - 7;
            prim = (Primitive *)(sVar33 & 0xfffffffffffffff0);
            goto LAB_01689f13;
          }
          break;
        }
        auVar22._4_4_ = uStack_23b4;
        auVar22._0_4_ = local_23b8;
        auVar22._8_4_ = uStack_23b0;
        auVar22._12_4_ = uStack_23ac;
        auVar22._16_4_ = uStack_23a8;
        auVar22._20_4_ = uStack_23a4;
        auVar22._24_4_ = uStack_23a0;
        auVar22._28_4_ = uStack_239c;
        auVar23._4_4_ = fStack_2394;
        auVar23._0_4_ = local_2398;
        auVar23._8_4_ = fStack_2390;
        auVar23._12_4_ = fStack_238c;
        auVar23._16_4_ = fStack_2388;
        auVar23._20_4_ = fStack_2384;
        auVar23._24_4_ = fStack_2380;
        auVar23._28_4_ = fStack_237c;
        auVar50 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar35),auVar22,auVar23);
        auVar21._4_4_ = uStack_23d4;
        auVar21._0_4_ = local_23d8;
        auVar21._8_4_ = uStack_23d0;
        auVar21._12_4_ = uStack_23cc;
        auVar21._16_4_ = uStack_23c8;
        auVar21._20_4_ = uStack_23c4;
        auVar21._24_4_ = uStack_23c0;
        auVar21._28_4_ = uStack_23bc;
        auVar8._8_8_ = uStack_2560;
        auVar8._0_8_ = local_2568;
        auVar8._16_8_ = uStack_2558;
        auVar8._24_8_ = uStack_2550;
        auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar30),auVar21,auVar8);
        auVar8 = vpmaxsd_avx2(ZEXT1632(auVar50),ZEXT1632(auVar39));
        auVar19._4_4_ = uStack_2414;
        auVar19._0_4_ = local_2418;
        auVar19._8_4_ = uStack_2410;
        auVar19._12_4_ = uStack_240c;
        auVar19._16_4_ = uStack_2408;
        auVar19._20_4_ = uStack_2404;
        auVar19._24_4_ = uStack_2400;
        auVar19._28_4_ = uStack_23fc;
        auVar20._8_8_ = uStack_23f0;
        auVar20._0_8_ = local_23f8;
        auVar20._16_8_ = uStack_23e8;
        auVar20._24_8_ = uStack_23e0;
        auVar50 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar36),auVar19,auVar20);
        auVar9._4_4_ = uStack_24f4;
        auVar9._0_4_ = local_24f8;
        auVar9._8_4_ = uStack_24f0;
        auVar9._12_4_ = uStack_24ec;
        auVar9._16_4_ = uStack_24e8;
        auVar9._20_4_ = uStack_24e4;
        auVar9._24_4_ = uStack_24e0;
        auVar9._28_4_ = uStack_24dc;
        auVar9 = vpmaxsd_avx2(ZEXT1632(auVar50),auVar9);
        auVar8 = vpmaxsd_avx2(auVar8,auVar9);
        auVar17._4_4_ = uStack_2454;
        auVar17._0_4_ = local_2458;
        auVar17._8_4_ = uStack_2450;
        auVar17._12_4_ = uStack_244c;
        auVar17._16_4_ = uStack_2448;
        auVar17._20_4_ = uStack_2444;
        auVar17._24_4_ = uStack_2440;
        auVar17._28_4_ = uStack_243c;
        auVar18._4_4_ = fStack_2434;
        auVar18._0_4_ = local_2438;
        auVar18._8_4_ = fStack_2430;
        auVar18._12_4_ = fStack_242c;
        auVar18._16_4_ = fStack_2428;
        auVar18._20_4_ = fStack_2424;
        auVar18._24_4_ = fStack_2420;
        auVar18._28_4_ = fStack_241c;
        auVar50 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar33 + 0x40 + (uVar35 ^ 0x20)),auVar17,
                                  auVar18);
        auVar15._4_4_ = uStack_2494;
        auVar15._0_4_ = local_2498;
        auVar15._8_4_ = uStack_2490;
        auVar15._12_4_ = uStack_248c;
        auVar15._16_4_ = uStack_2488;
        auVar15._20_4_ = uStack_2484;
        auVar15._24_4_ = uStack_2480;
        auVar15._28_4_ = uStack_247c;
        auVar16._8_8_ = uStack_2470;
        auVar16._0_8_ = local_2478;
        auVar16._16_8_ = uStack_2468;
        auVar16._24_8_ = uStack_2460;
        auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar33 + 0x40 + (uVar30 ^ 0x20)),auVar15,
                                  auVar16);
        auVar9 = vpminsd_avx2(ZEXT1632(auVar50),ZEXT1632(auVar39));
        auVar13._4_4_ = uStack_24d4;
        auVar13._0_4_ = local_24d8;
        auVar13._8_4_ = uStack_24d0;
        auVar13._12_4_ = uStack_24cc;
        auVar13._16_4_ = uStack_24c8;
        auVar13._20_4_ = uStack_24c4;
        auVar13._24_4_ = uStack_24c0;
        auVar13._28_4_ = uStack_24bc;
        auVar14._8_8_ = uStack_24b0;
        auVar14._0_8_ = local_24b8;
        auVar14._16_8_ = uStack_24a8;
        auVar14._24_8_ = uStack_24a0;
        auVar50 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar33 + 0x40 + (uVar36 ^ 0x20)),auVar13,
                                  auVar14);
        auVar10._4_4_ = uStack_2514;
        auVar10._0_4_ = local_2518;
        auVar10._8_4_ = uStack_2510;
        auVar10._12_4_ = uStack_250c;
        auVar10._16_4_ = uStack_2508;
        auVar10._20_4_ = uStack_2504;
        auVar10._24_4_ = uStack_2500;
        auVar10._28_4_ = uStack_24fc;
        auVar10 = vpminsd_avx2(ZEXT1632(auVar50),auVar10);
        auVar9 = vpminsd_avx2(auVar9,auVar10);
        auVar8 = vcmpps_avx(auVar8,auVar9,2);
        auVar45 = ZEXT3264(auVar8);
        uVar25 = vmovmskps_avx(auVar8);
        if (uVar25 == 0) break;
        uVar29 = (ulong)(uVar25 & 0xff);
        sVar34 = 0;
        sVar31 = 8;
        do {
          lVar11 = 0;
          for (uVar12 = uVar29; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar1 = *(undefined4 *)(sVar33 + 0x40 + lVar11 * 4);
          auVar41._4_4_ = uVar1;
          auVar41._0_4_ = uVar1;
          auVar41._8_4_ = uVar1;
          auVar41._12_4_ = uVar1;
          auVar47 = vfmadd213ps_fma(auVar41,auVar56,auVar65);
          uVar1 = *(undefined4 *)(sVar33 + 0x80 + lVar11 * 4);
          auVar48._4_4_ = uVar1;
          auVar48._0_4_ = uVar1;
          auVar48._8_4_ = uVar1;
          auVar48._12_4_ = uVar1;
          auVar57 = vfmadd213ps_fma(auVar48,auVar4,auVar62);
          uVar1 = *(undefined4 *)(sVar33 + 0xc0 + lVar11 * 4);
          auVar51._4_4_ = uVar1;
          auVar51._0_4_ = uVar1;
          auVar51._8_4_ = uVar1;
          auVar51._12_4_ = uVar1;
          auVar44 = vfmadd213ps_fma(auVar51,auVar49,auVar63);
          uVar1 = *(undefined4 *)(sVar33 + 0x60 + lVar11 * 4);
          auVar52._4_4_ = uVar1;
          auVar52._0_4_ = uVar1;
          auVar52._8_4_ = uVar1;
          auVar52._12_4_ = uVar1;
          auVar5 = vfmadd213ps_fma(auVar52,auVar56,auVar65);
          uVar1 = *(undefined4 *)(sVar33 + 0xa0 + lVar11 * 4);
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar6 = vfmadd213ps_fma(auVar55,auVar4,auVar62);
          uVar1 = *(undefined4 *)(sVar33 + 0xe0 + lVar11 * 4);
          auVar58._4_4_ = uVar1;
          auVar58._0_4_ = uVar1;
          auVar58._8_4_ = uVar1;
          auVar58._12_4_ = uVar1;
          auVar7 = vfmadd213ps_fma(auVar58,auVar49,auVar63);
          auVar50 = vpminsd_avx(auVar47,auVar5);
          auVar39 = vpminsd_avx(auVar57,auVar6);
          auVar50 = vpmaxsd_avx(auVar50,auVar39);
          auVar39 = vpminsd_avx(auVar44,auVar7);
          auVar39 = vpmaxsd_avx(auVar39,auVar3);
          auVar50 = vpmaxsd_avx(auVar50,auVar39);
          auVar39 = vpmaxsd_avx(auVar47,auVar5);
          auVar47 = vpmaxsd_avx(auVar57,auVar6);
          auVar47 = vpminsd_avx(auVar39,auVar47);
          auVar39 = vpmaxsd_avx(auVar44,auVar7);
          auVar39 = vpminsd_avx(auVar39,(undefined1  [16])bi_8.field_0);
          auVar39 = vpminsd_avx(auVar47,auVar39);
          auVar50 = vcmpps_avx(auVar50,auVar39,2);
          auVar45 = ZEXT1664(auVar50);
          uVar25 = vmovmskps_avx(auVar50);
          sVar32 = sVar31;
          if (uVar25 != 0) {
            sVar32 = *(size_t *)(sVar33 + lVar11 * 8);
            if (sVar31 != 8) {
              (pSVar38->ptr).ptr = sVar31;
              pSVar38->mask = sVar34;
              pSVar38 = pSVar38 + 1;
            }
            sVar34 = (size_t)(uVar25 & 0xff);
          }
          uVar29 = uVar29 - 1 & uVar29;
          sVar31 = sVar32;
        } while (uVar29 != 0);
        sVar33 = sVar32;
        pSVar37 = pSVar38;
      } while (sVar32 != 8);
    }
  } while( true );
  while( true ) {
    auVar66 = ZEXT1664(auVar50);
    valid0.field_0 = aVar42;
    InstanceIntersectorK<4>::occluded(local_2548,&valid0,&pre,ray,context,prim);
    auVar50 = auVar66._0_16_;
    aVar42.v = (__m128)vandnps_avx((undefined1  [16])local_2548,valid0.field_0);
    auVar39 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_2548;
    prim = prim + 1;
    if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar39[0xf])
    break;
LAB_01689f13:
    auVar50 = auVar66._0_16_;
    uVar27 = uVar27 - 1;
    if (uVar27 == 0) break;
  }
  auVar50 = vpcmpeqd_avx(auVar50,auVar50);
  auVar66 = ZEXT1664(auVar50);
  auVar43._0_4_ = auVar50._0_4_ ^ aVar42.i[0];
  auVar43._4_4_ = auVar50._4_4_ ^ aVar42.i[1];
  auVar43._8_4_ = auVar50._8_4_ ^ aVar42.i[2];
  auVar43._12_4_ = auVar50._12_4_ ^ aVar42.i[3];
  auVar39 = vorps_avx(auVar64._0_16_,auVar43);
  auVar64 = ZEXT1664(auVar39);
  auVar47 = local_26d8 & ~auVar39;
  auVar50 = local_26d8;
  if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar47[0xf])
  goto LAB_0168a010;
  local_26d8 = vandnps_avx(auVar39,local_26d8);
  auVar44._8_4_ = 0xff800000;
  auVar44._0_8_ = 0xff800000ff800000;
  auVar44._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar44,auVar39);
  goto LAB_01689cd4;
LAB_0168a010:
  if (uVar28 == 0) {
    auVar62 = vpcmpeqd_avx(auVar50,auVar50);
    auVar62 = vpcmpeqd_avx(auVar62,(undefined1  [16])local_25c8);
    auVar62 = vpand_avx(auVar64._0_16_,auVar62);
    auVar49._8_4_ = 0xff800000;
    auVar49._0_8_ = 0xff800000ff800000;
    auVar49._12_4_ = 0xff800000;
    auVar62 = vmaskmovps_avx(auVar62,auVar49);
    *(undefined1 (*) [16])(ray + 0x80) = auVar62;
    return;
  }
  goto LAB_016898e2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }